

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

int64_t get_sse(AV1_COMP *cpi,MACROBLOCK *x,int64_t *sse_y)

{
  uint8_t uVar1;
  buf_2d *pbVar2;
  long lVar3;
  ulong uVar4;
  int *piVar5;
  bool bVar6;
  uint sse;
  uint local_54;
  ulong *local_50;
  MACROBLOCK *local_48;
  MB_MODE_INFO *local_40;
  AV1_COMP *local_38;
  
  uVar1 = ((cpi->common).seq_params)->monochrome;
  local_40 = *(x->e_mbd).mi;
  piVar5 = &(x->e_mbd).plane[0].subsampling_x;
  pbVar2 = &x->plane[0].src;
  lVar3 = 0;
  uVar4 = 0;
  local_50 = (ulong *)sse_y;
  local_48 = x;
  local_38 = cpi;
  do {
    if ((uVar4 != 0) && ((local_48->e_mbd).is_chroma_ref != true)) break;
    bVar6 = local_50 != (ulong *)0x0;
    (*local_38->ppi->fn_ptr[av1_ss_size_lookup[local_40->bsize][*piVar5][piVar5[1]]].vf)
              (pbVar2->buf,pbVar2->stride,((buf_2d *)(piVar5 + 3))->buf,piVar5[9],&local_54);
    if (bVar6 && uVar4 == 0) {
      *local_50 = (ulong)local_54;
    }
    lVar3 = lVar3 + (ulong)local_54;
    if (uVar1 != '\0') break;
    piVar5 = piVar5 + 0x28c;
    pbVar2 = (buf_2d *)((long)(pbVar2 + 4) + 8);
    bVar6 = uVar4 < 2;
    uVar4 = uVar4 + 1;
  } while (bVar6);
  return lVar3 << 4;
}

Assistant:

static int64_t get_sse(const AV1_COMP *cpi, const MACROBLOCK *x,
                       int64_t *sse_y) {
  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  int64_t total_sse = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const struct macroblock_plane *const p = &x->plane[plane];
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE bs =
        get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);
    unsigned int sse;

    cpi->ppi->fn_ptr[bs].vf(p->src.buf, p->src.stride, pd->dst.buf,
                            pd->dst.stride, &sse);
    total_sse += sse;
    if (!plane && sse_y) *sse_y = sse;
  }
  total_sse <<= 4;
  return total_sse;
}